

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Tags::SimpleTag::Parse(SimpleTag *this,IMkvReader *pReader,longlong pos,longlong size)

{
  long stop;
  bool bVar1;
  long lVar2;
  long lVar3;
  SimpleTag *str;
  long unaff_R15;
  longlong size_1;
  longlong id;
  longlong local_58;
  SimpleTag *local_50;
  SimpleTag *local_48;
  long local_40;
  long local_38;
  
  stop = size + pos;
  if (0 < size) {
    local_48 = (SimpleTag *)&this->m_tag_string;
    local_58 = pos;
    local_50 = this;
    do {
      lVar3 = ParseElementHeader(pReader,&local_58,stop,&local_38,&local_40);
      lVar2 = local_40;
      bVar1 = true;
      if (-1 < lVar3) {
        if (local_40 == 0) {
          bVar1 = false;
          lVar3 = unaff_R15;
        }
        else {
          str = local_48;
          if (((local_38 != 0x4487) && (str = local_50, local_38 != 0x45a3)) ||
             (lVar3 = UnserializeString(pReader,local_58,local_40,&str->m_tag_name), lVar3 == 0)) {
            local_58 = lVar2 + local_58;
            bVar1 = stop < local_58;
            lVar3 = unaff_R15;
            if (stop < local_58) {
              lVar3 = -2;
            }
          }
        }
      }
      if (bVar1) {
        return lVar3;
      }
      pos = local_58;
      unaff_R15 = lVar3;
    } while (local_58 < stop);
  }
  return (ulong)(pos == stop) * 2 + -2;
}

Assistant:

long Tags::SimpleTag::Parse(IMkvReader* pReader, long long pos,
                            long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTagName) {
      status = UnserializeString(pReader, pos, size, m_tag_name);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTagString) {
      status = UnserializeString(pReader, pos, size, m_tag_string);

      if (status)
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}